

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QObject * qt_qFindChild_helper
                    (QObject *parent,QAnyStringView name,QMetaObject *mo,FindChildOptions options)

{
  QObjectData *pQVar1;
  QObject **ppQVar2;
  long lVar3;
  bool bVar4;
  QObject *pQVar5;
  QObject *pQVar6;
  long lVar7;
  
  pQVar1 = (parent->d_ptr).d;
  ppQVar2 = (pQVar1->children).d.ptr;
  lVar3 = (pQVar1->children).d.size;
  lVar7 = 0;
  do {
    if (lVar3 << 3 == lVar7) {
      if (((uint)options.super_QFlagsStorageHelper<Qt::FindChildOption,_4>.
                 super_QFlagsStorage<Qt::FindChildOption>.i & 1) == 0) {
        pQVar6 = (QObject *)0x0;
      }
      else {
        pQVar1 = (parent->d_ptr).d;
        ppQVar2 = (pQVar1->children).d.ptr;
        lVar3 = (pQVar1->children).d.size;
        lVar7 = 0;
        do {
          if (lVar3 << 3 == lVar7) {
            return (QObject *)0x0;
          }
          pQVar6 = qt_qFindChild_helper(*(QObject **)((long)ppQVar2 + lVar7),name,mo,options);
          lVar7 = lVar7 + 8;
        } while (pQVar6 == (QObject *)0x0);
      }
      return pQVar6;
    }
    pQVar6 = *(QObject **)((long)ppQVar2 + lVar7);
    pQVar5 = QMetaObject::cast(mo,pQVar6);
    if (pQVar5 != (QObject *)0x0) {
      if (name.field_0.m_data == (void *)0x0) {
        return pQVar6;
      }
      bVar4 = matches_objectName_non_null(pQVar6,name);
      if (bVar4) {
        return pQVar6;
      }
    }
    lVar7 = lVar7 + 8;
  } while( true );
}

Assistant:

QObject *qt_qFindChild_helper(const QObject *parent, QAnyStringView name, const QMetaObject &mo, Qt::FindChildOptions options)
{
    Q_ASSERT(parent);
    for (QObject *obj : parent->children()) {
        if (mo.cast(obj) && (name.isNull() || matches_objectName_non_null(obj, name)))
           return obj;
    }
    if (options & Qt::FindChildrenRecursively) {
        for (QObject *child : parent->children()) {
            if (QObject *obj = qt_qFindChild_helper(child, name, mo, options))
                return obj;
        }
    }
    return nullptr;
}